

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O2

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx,JpegdSyntax *jpegd_syntax)

{
  int iVar1;
  DcTable *pDVar2;
  DcTable *pDVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  undefined2 uVar13;
  ushort *puVar14;
  long lVar15;
  RK_U16 min_code_dc [16];
  RK_U16 min_code_ac [16];
  RK_U16 acc_addr_dc [16];
  RK_U16 acc_addr_ac [16];
  DcTable *local_128 [3];
  AcTable *local_110;
  DcTable *local_108;
  AcTable *local_100;
  RK_U8 htbl_value [192];
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","jpegd_write_rkv_htbl");
  }
  pvVar5 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  lVar15 = (long)pvVar5 + 0x2c0;
  pvVar5 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
  puVar14 = (ushort *)((long)pvVar5 + 0x180);
  min_code_ac[8] = 0;
  min_code_ac[9] = 0;
  min_code_ac[10] = 0;
  min_code_ac[0xb] = 0;
  min_code_ac[0xc] = 0;
  min_code_ac[0xd] = 0;
  min_code_ac[0xe] = 0;
  min_code_ac[0xf] = 0;
  min_code_ac[0] = 0;
  min_code_ac[1] = 0;
  min_code_ac[2] = 0;
  min_code_ac[3] = 0;
  min_code_ac[4] = 0;
  min_code_ac[5] = 0;
  min_code_ac[6] = 0;
  min_code_ac[7] = 0;
  min_code_dc[8] = 0;
  min_code_dc[9] = 0;
  min_code_dc[10] = 0;
  min_code_dc[0xb] = 0;
  min_code_dc[0xc] = 0;
  min_code_dc[0xd] = 0;
  min_code_dc[0xe] = 0;
  min_code_dc[0xf] = 0;
  min_code_dc[0] = 0;
  min_code_dc[1] = 0;
  min_code_dc[2] = 0;
  min_code_dc[3] = 0;
  min_code_dc[4] = 0;
  min_code_dc[5] = 0;
  min_code_dc[6] = 0;
  min_code_dc[7] = 0;
  acc_addr_ac[8] = 0;
  acc_addr_ac[9] = 0;
  acc_addr_ac[10] = 0;
  acc_addr_ac[0xb] = 0;
  acc_addr_ac[0xc] = 0;
  acc_addr_ac[0xd] = 0;
  acc_addr_ac[0xe] = 0;
  acc_addr_ac[0xf] = 0;
  acc_addr_ac[0] = 0;
  acc_addr_ac[1] = 0;
  acc_addr_ac[2] = 0;
  acc_addr_ac[3] = 0;
  acc_addr_ac[4] = 0;
  acc_addr_ac[5] = 0;
  acc_addr_ac[6] = 0;
  acc_addr_ac[7] = 0;
  acc_addr_dc[8] = 0;
  acc_addr_dc[9] = 0;
  acc_addr_dc[10] = 0;
  acc_addr_dc[0xb] = 0;
  acc_addr_dc[0xc] = 0;
  acc_addr_dc[0xd] = 0;
  acc_addr_dc[0xe] = 0;
  acc_addr_dc[0xf] = 0;
  acc_addr_dc[0] = 0;
  acc_addr_dc[1] = 0;
  acc_addr_dc[2] = 0;
  acc_addr_dc[3] = 0;
  acc_addr_dc[4] = 0;
  acc_addr_dc[5] = 0;
  acc_addr_dc[6] = 0;
  acc_addr_dc[7] = 0;
  memset(htbl_value,0,0xc0);
  local_128[0] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[0];
  local_128[1] = (DcTable *)(jpegd_syntax->ac_table + jpegd_syntax->ac_index[0]);
  local_128[2] = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  local_110 = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  local_108 = jpegd_syntax->dc_table + jpegd_syntax->dc_index[1];
  local_100 = jpegd_syntax->ac_table + jpegd_syntax->ac_index[1];
  for (uVar8 = 0; uVar8 < jpegd_syntax->nb_components; uVar8 = uVar8 + 1) {
    uVar6 = (ulong)(uint)((int)uVar8 * 2);
    min_code_dc._0_8_ = min_code_dc._0_8_ & 0xffffffffffff0000;
    pDVar2 = local_128[uVar6];
    acc_addr_dc._0_8_ = acc_addr_dc._0_8_ & 0xffffffffffff0000;
    pDVar3 = local_128[uVar6 + 1];
    uVar11 = 0;
    iVar12 = 0;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
      iVar1 = *(int *)((long)pDVar2->bits + lVar9 * 2);
      uVar13 = (undefined2)uVar11;
      if (((lVar9 != 0) && (iVar1 == 0)) &&
         (uVar4 = (uint)*(ushort *)((long)min_code_dc + lVar9 + -2) * 2, (uVar11 & 0xffff) <= uVar4)
         ) {
        uVar13 = (undefined2)uVar4;
      }
      *(undefined2 *)((long)min_code_dc + lVar9) = uVar13;
      iVar12 = iVar12 + iVar1;
      *(short *)((long)acc_addr_dc + lVar9) = (short)iVar12;
      uVar11 = (uVar11 + iVar1) * 2;
    }
    sVar10 = (short)pDVar2->bits[0xf] + -1;
    if (pDVar2->bits[0xf] == 0) {
      sVar10 = 0;
    }
    min_code_ac._0_8_ = min_code_ac._0_8_ & 0xffffffffffff0000;
    acc_addr_ac._0_8_ = acc_addr_ac._0_8_ & 0xffffffffffff0000;
    min_code_dc[0] = sVar10 + min_code_dc[0xf];
    uVar11 = 0;
    iVar12 = 0;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
      iVar1 = *(int *)((long)pDVar3->bits + lVar9 * 2);
      uVar13 = (undefined2)uVar11;
      if (((lVar9 != 0) && (iVar1 == 0)) &&
         (uVar4 = (uint)*(ushort *)((long)min_code_dc + lVar9 + 0x1e) * 2,
         (uVar11 & 0xffff) <= uVar4)) {
        uVar13 = (undefined2)uVar4;
      }
      *(undefined2 *)((long)min_code_ac + lVar9) = uVar13;
      iVar12 = iVar12 + iVar1;
      *(short *)((long)acc_addr_ac + lVar9) = (short)iVar12;
      uVar11 = (uVar11 + iVar1) * 2;
    }
    sVar10 = (short)pDVar3->bits[0xf] + -1;
    if (pDVar3->bits[0xf] == 0) {
      sVar10 = 0;
    }
    min_code_ac[0] = sVar10 + min_code_ac[0xf];
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
      *(undefined2 *)((long)puVar14 + lVar9) = *(undefined2 *)((long)min_code_dc + lVar9);
    }
    puVar14 = puVar14 + 0x10;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      *puVar14 = acc_addr_dc[lVar9 * 2 + 1] << 8 | acc_addr_dc[lVar9 * 2];
      puVar14 = puVar14 + 1;
    }
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 2) {
      *(undefined2 *)((long)puVar14 + lVar9) = *(undefined2 *)((long)min_code_ac + lVar9);
    }
    puVar14 = puVar14 + 0x10;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      *puVar14 = acc_addr_ac[lVar9 * 2 + 1] << 8 | acc_addr_ac[lVar9 * 2];
      puVar14 = puVar14 + 1;
    }
    for (lVar9 = 0; lVar7 = 0x10, lVar9 != 0xc; lVar9 = lVar9 + 1) {
      htbl_value[lVar9] = (RK_U8)pDVar2->vals[lVar9];
    }
    for (; lVar7 != 0xb2; lVar7 = lVar7 + 1) {
      htbl_value[lVar7] = (RK_U8)pDVar3->bits[lVar7];
    }
    for (lVar9 = 0; lVar9 != 0xc0; lVar9 = lVar9 + 1) {
      *(RK_U8 *)(lVar15 + lVar9) = htbl_value[lVar9];
    }
    lVar15 = lVar15 + 0xc0;
  }
  if ((jpegd_debug >> 8 & 1) != 0) {
    pvVar5 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman value tbl----------------------\n",
               (char *)0x0);
    for (uVar8 = 0; uVar8 < 0x240; uVar8 = uVar8 + 8) {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c7),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c6),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c5),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c4),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c3),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c2),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c1),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x2c0));
    }
    pvVar5 = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_rkv_htbl");
    _mpp_log_l(4,"hal_jpegd_rkv","--------------huffman mincode tbl----------------------\n",
               (char *)0x0);
    for (uVar8 = 0; uVar8 < 0x120; uVar8 = uVar8 + 8) {
      _mpp_log_l(4,"hal_jpegd_rkv","%02x%02x%02x%02x%02x%02x%02x%02x\n",(char *)0x0,
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x187),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x186),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x185),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x184),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x183),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x182),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x181),
                 (ulong)*(byte *)((long)pvVar5 + uVar8 + 0x180));
    }
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","exit\n","jpegd_write_rkv_htbl");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_write_rkv_htbl(JpegdHalCtx *ctx, JpegdSyntax *jpegd_syntax)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;

    JpegdSyntax *s = jpegd_syntax;
    void * htbl_ptr[6] = {NULL};
    RK_U32 i, j, k = 0;
    RK_U8 *p_htbl_value = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;
    RK_U16 *p_htbl_mincode = (RK_U16 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET  / 2;
    RK_U16 min_code_ac[16] = {0};
    RK_U16 min_code_dc[16] = {0};
    RK_U16 acc_addr_ac[16] = {0};
    RK_U16 acc_addr_dc[16] = {0};
    RK_U8 htbl_value[192] = {0};
    RK_U16 code = 0;
    RK_S32 addr = 0;
    RK_U32 len = 0;
    AcTable *ac_ptr;
    DcTable *dc_ptr;

    htbl_ptr[0] = &s->dc_table[s->dc_index[0]];
    htbl_ptr[1] = &s->ac_table[s->ac_index[0]];

    htbl_ptr[2] = &s->dc_table[s->dc_index[1]];
    htbl_ptr[3] = &s->ac_table[s->ac_index[1]];

    htbl_ptr[4] = htbl_ptr[2];
    htbl_ptr[5] = htbl_ptr[3];

    for (k = 0; k < s->nb_components; k++) {
        dc_ptr = (DcTable *)htbl_ptr[k * 2];
        ac_ptr = (AcTable *)htbl_ptr[k * 2 + 1];

        len = dc_ptr->bits[0];
        code = addr = 0;
        min_code_dc[0] = 0;
        acc_addr_dc[0] = 0;

        for (j = 0; j < 16; j++) {
            len = dc_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_dc[j - 1] << 1))
                    min_code_dc[j] = code;
                else
                    min_code_dc[j] = min_code_dc[j - 1] << 1;
            } else {
                min_code_dc[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_dc[j] = addr;
            code <<= 1;

        }

        if (dc_ptr->bits[15])
            min_code_dc[0] = min_code_dc[15] + dc_ptr->bits[15] - 1;
        else
            min_code_dc[0] = min_code_dc[15];

        len = ac_ptr->bits[0];
        code = addr = 0;
        min_code_ac[0] = 0;
        acc_addr_ac[0] = 0;
        for (j = 0; j < 16; j++) {
            len = ac_ptr->bits[j];

            if (len == 0 && j > 0) {
                if (code > (min_code_ac[j - 1] << 1))
                    min_code_ac[j] = code;
                else
                    min_code_ac[j] = min_code_ac[j - 1] << 1;
            } else {
                min_code_ac[j] = code;
            }

            code += len;
            addr += len;
            acc_addr_ac[j] = addr;
            code <<= 1;
        }

        if (ac_ptr->bits[15])
            min_code_ac[0] = min_code_ac[15] + ac_ptr->bits[15] - 1;
        else
            min_code_ac[0] = min_code_ac[15];

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_dc[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_dc[2 * i] | acc_addr_dc[2 * i + 1] << 8;
        }

        for (i = 0; i < 16; i++) {
            *p_htbl_mincode++ = min_code_ac[i];
        }

        for (i = 0; i < 8; i++) {
            *p_htbl_mincode++ = acc_addr_ac[2 * i] | acc_addr_ac[2 * i + 1] << 8;
        }

        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i] = dc_ptr->vals[i];
        }

        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            htbl_value[i + 16] = ac_ptr->vals[i];
        }

        for (i = 0; i < 12 * 16; i++) {
            *p_htbl_value++ = htbl_value[i];
        }
    }

    if (jpegd_debug & JPEGD_DBG_HAL_TBL) {
        RK_U8 *data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_VALUE_TBL_OFFSET;

        mpp_log("--------------huffman value tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_VALUE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }

        data = NULL;
        data = (RK_U8 *)mpp_buffer_get_ptr(ctx->pTableBase) + RKD_HUFFMAN_MINCODE_TBL_OFFSET;

        mpp_log("--------------huffman mincode tbl----------------------\n");
        for (i = 0; i < RKD_HUFFMAN_MINCODE_TBL_SIZE; i += 8) {
            mpp_log("%02x%02x%02x%02x%02x%02x%02x%02x\n",
                    data[i + 7], data[i + 6], data[i + 5], data[i + 4],
                    data[i + 3], data[i + 2], data[i + 1], data[i + 0]);
        }
    }

    jpegd_dbg_func("exit\n");
    return ret;
}